

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_decode_huffman(huffman *hf,uint rbits)

{
  wchar_t c;
  uint rbits_local;
  huffman *hf_local;
  
  hf_local._4_4_ = (wchar_t)hf->tbl[rbits >> ((byte)hf->shift_bits & 0x1f)];
  if (hf->len_size <= hf_local._4_4_) {
    hf_local._4_4_ = lzx_decode_huffman_tree(hf,rbits,hf_local._4_4_);
  }
  return hf_local._4_4_;
}

Assistant:

static inline int
lzx_decode_huffman(struct huffman *hf, unsigned rbits)
{
	int c;
	/*
	 * At first search an index table for a bit pattern.
	 * If it fails, search a huffman tree for.
	 */
	c = hf->tbl[rbits >> hf->shift_bits];
	if (c < hf->len_size)
		return (c);
	/* This bit pattern needs to be found out at a huffman tree. */
	return (lzx_decode_huffman_tree(hf, rbits, c));
}